

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int eval_binop_operands(c2m_ctx_t c2m_ctx,node_t_conflict tree,val *v1,val *v2)

{
  int iVar1;
  int iVar2;
  node_t pnVar3;
  val vVar4;
  
  vVar4 = eval(c2m_ctx,(tree->u).ops.head);
  v1->uns_p = vVar4.uns_p;
  (v1->u).i_val = (mir_llong)vVar4.u;
  pnVar3 = (tree->u).ops.head;
  if (pnVar3 == (node_t)0x0) {
    pnVar3 = (node_t_conflict)0x0;
  }
  else {
    pnVar3 = (pnVar3->op_link).next;
  }
  vVar4 = eval(c2m_ctx,pnVar3);
  iVar1 = vVar4.uns_p;
  v2->uns_p = iVar1;
  (v2->u).i_val = (mir_llong)vVar4.u;
  iVar2 = v1->uns_p;
  if (iVar2 == 0) {
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 1;
      v1->uns_p = 1;
    }
  }
  else if (iVar1 == 0) {
    v2->uns_p = 1;
    iVar2 = v1->uns_p;
  }
  return iVar2;
}

Assistant:

static int eval_binop_operands (c2m_ctx_t c2m_ctx, node_t tree, struct val *v1, struct val *v2) {
  *v1 = eval (c2m_ctx, NL_HEAD (tree->u.ops));
  *v2 = eval (c2m_ctx, NL_EL (tree->u.ops, 1));
  if (v1->uns_p && !v2->uns_p) {
    v2->uns_p = TRUE;
    v2->u.u_val = v2->u.i_val;
  } else if (!v1->uns_p && v2->uns_p) {
    v1->uns_p = TRUE;
    v1->u.u_val = v1->u.i_val;
  }
  return v1->uns_p;
}